

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O0

int __thiscall
pg::PTLSolver::attractTangles(PTLSolver *this,int pl,int v,bitset *R,bitset *Z,bitset *G)

{
  int t;
  vector<int,_std::allocator<int>_> *pvVar1;
  bool bVar2;
  reference piVar3;
  ostream *poVar4;
  reference pvVar5;
  const_iterator cStack_58;
  int from;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_cur;
  int added;
  bitset *G_local;
  bitset *Z_local;
  bitset *R_local;
  int v_local;
  int pl_local;
  PTLSolver *this_local;
  
  in_cur._4_4_ = 0;
  pvVar1 = this->tin;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(pvVar1 + v);
  cStack_58 = std::vector<int,_std::allocator<int>_>::end(pvVar1 + v);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa8), bVar2) {
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    t = *piVar3;
    bVar2 = attractTangle(this,t,pl,R,Z,G);
    if ((bVar2) && (in_cur._4_4_ = in_cur._4_4_ + 1, 2 < (this->super_Solver).trace)) {
      poVar4 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracted \x1b[1;36m");
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->tpr,(long)t);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
      poVar4 = std::operator<<(poVar4,"\x1b[m-tangle ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,t);
      poVar4 = std::operator<<(poVar4," to \x1b[1;36m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pl);
      poVar4 = std::operator<<(poVar4,"\x1b[m");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return in_cur._4_4_;
}

Assistant:

inline int
PTLSolver::attractTangles(const int pl, int v, bitset &R, bitset &Z, bitset &G)
{
    int added = 0;
    const auto &in_cur = tin[v];
    for (int from : in_cur) {
        if (attractTangle(from, pl, R, Z, G)) {
            added++;
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[1;36m" << tpr[from] << "\033[m-tangle " << from << " to \033[1;36m" << pl << "\033[m" << std::endl;
            }
#endif
        }
    }
    return added;
}